

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::fms(Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  BasicType BVar1;
  float fVar2;
  float __y;
  float __z;
  double dVar3;
  double __y_00;
  double __z_00;
  Literal *right_local;
  Literal *left_local;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == f32) {
    fVar2 = getf32(left);
    __y = getf32(right);
    __z = getf32(this);
    fVar2 = fmaf(-fVar2,__y,__z);
    Literal(__return_storage_ptr__,fVar2);
  }
  else {
    if (BVar1 != f64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x641);
    }
    dVar3 = getf64(left);
    __y_00 = getf64(right);
    __z_00 = getf64(this);
    dVar3 = ::fma(-dVar3,__y_00,__z_00);
    Literal(__return_storage_ptr__,dVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::fms(const Literal& left, const Literal& right) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(::fmaf(-left.getf32(), right.getf32(), getf32()));
      break;
    case Type::f64:
      return Literal(::fma(-left.getf64(), right.getf64(), getf64()));
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}